

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_pivot.cpp
# Opt level: O2

void duckdb::ExtractPivotExpressions(ParsedExpression *expr,case_insensitive_set_t *handled_columns)

{
  bool bVar1;
  ColumnRefExpression *this;
  string *__v;
  BinderException *this_00;
  allocator local_41;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  if ((expr->super_BaseExpression).type == COLUMN_REF) {
    this = BaseExpression::Cast<duckdb::ColumnRefExpression>(&expr->super_BaseExpression);
    bVar1 = ColumnRefExpression::IsQualified(this);
    if (bVar1) {
      this_00 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)local_40._M_pod_data,"PIVOT expression cannot contain qualified columns",
                 &local_41);
      BinderException::BinderException<>(this_00,expr,(string *)&local_40);
      __cxa_throw(this_00,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    __v = ColumnRefExpression::GetColumnName_abi_cxx11_(this);
    ::std::__detail::
    _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::insert((_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              *)handled_columns,__v);
  }
  local_40._8_8_ = 0;
  local_28 = ::std::
             _Function_handler<void_(duckdb::ParsedExpression_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder/tableref/bind_pivot.cpp:69:12)>
             ::_M_invoke;
  local_30 = ::std::
             _Function_handler<void_(duckdb::ParsedExpression_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder/tableref/bind_pivot.cpp:69:12)>
             ::_M_manager;
  local_40._M_unused._M_object = handled_columns;
  ParsedExpressionIterator::EnumerateChildren
            (expr,(function<void_(duckdb::ParsedExpression_&)> *)&local_40);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_40);
  return;
}

Assistant:

static void ExtractPivotExpressions(ParsedExpression &expr, case_insensitive_set_t &handled_columns) {
	if (expr.GetExpressionType() == ExpressionType::COLUMN_REF) {
		auto &child_colref = expr.Cast<ColumnRefExpression>();
		if (child_colref.IsQualified()) {
			throw BinderException(expr, "PIVOT expression cannot contain qualified columns");
		}
		handled_columns.insert(child_colref.GetColumnName());
	}
	ParsedExpressionIterator::EnumerateChildren(
	    expr, [&](ParsedExpression &child) { ExtractPivotExpressions(child, handled_columns); });
}